

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

size_t duckdb_je_arena_fill_small_fresh
                 (tsdn_t *tsdn,arena_t *arena,szind_t binind,void **ptrs,size_t nfill,_Bool zero)

{
  byte bVar1;
  _Bool _Var2;
  byte bVar3;
  arena_t *ptrs_00;
  bin_t *pbVar4;
  long in_RCX;
  uint in_EDX;
  long in_RDI;
  edata_t *in_R8;
  byte in_R9B;
  size_t batch;
  edata_list_active_t fulls;
  edata_t *slab;
  size_t filled;
  size_t nslab;
  bin_t *bin;
  uint binshard;
  _Bool manual_arena;
  size_t usize;
  size_t nregs;
  bin_info_t *bin_info;
  uint64_t *prng_state;
  ticker_geom_t *decay_ticker;
  tsd_t *tsd;
  uint8_t state_1;
  uint8_t state;
  uint8_t state_2;
  undefined4 in_stack_fffffffffffffeb8;
  int32_t in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffec4;
  arena_t *in_stack_fffffffffffffec8;
  edata_list_active_t in_stack_fffffffffffffed0;
  edata_t *item;
  edata_t *local_120;
  bin_info_t *bin_info_00;
  undefined7 in_stack_fffffffffffffef8;
  tsdn_t *tsdn_00;
  bin_info_t *pbVar5;
  undefined7 in_stack_ffffffffffffff18;
  
  bVar1 = in_R9B & 1;
  pbVar5 = duckdb_je_bin_infos + in_EDX;
  ptrs_00 = (arena_t *)(ulong)duckdb_je_bin_infos[in_EDX].nregs;
  tsdn_00 = (tsdn_t *)pbVar5->reg_size;
  _Var2 = arena_is_auto((arena_t *)0x24b7e62);
  bVar3 = (_Var2 ^ 0xffU) & 1;
  pbVar4 = duckdb_je_arena_bin_choose
                     ((tsdn_t *)in_stack_fffffffffffffed0.head.qlh_first,in_stack_fffffffffffffec8,
                      in_stack_fffffffffffffec4,
                      (uint *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  bin_info_00 = (bin_info_t *)0x0;
  local_120 = (edata_t *)0x0;
  item = (edata_t *)0x0;
  edata_list_active_init((edata_list_active_t *)&stack0xfffffffffffffed0);
  while( true ) {
    in_stack_fffffffffffffec4 = in_stack_fffffffffffffec4 & 0xffffff;
    if (local_120 < in_R8) {
      item = arena_slab_alloc(tsdn_00,(arena_t *)CONCAT17(bVar3,in_stack_fffffffffffffef8),
                              (szind_t)((ulong)pbVar4 >> 0x20),(uint)pbVar4,bin_info_00);
      in_stack_fffffffffffffec4 = CONCAT13(item != (edata_t *)0x0,(int3)in_stack_fffffffffffffec4);
    }
    if ((char)(in_stack_fffffffffffffec4 >> 0x18) == '\0') break;
    bin_info_00 = (bin_info_t *)((long)&bin_info_00->reg_size + 1);
    in_stack_fffffffffffffec8 = (arena_t *)((long)in_R8 - (long)local_120);
    if (ptrs_00 < (arena_t *)((long)in_R8 - (long)local_120)) {
      in_stack_fffffffffffffec8 = ptrs_00;
    }
    arena_slab_reg_alloc_batch
              (in_R8,(bin_info_t *)CONCAT17(bVar1,in_stack_ffffffffffffff18),
               (uint)((ulong)pbVar5 >> 0x20),(void **)ptrs_00);
    if ((bVar1 & 1) != 0) {
      memset(*(void **)(in_RCX + (long)local_120 * 8),0,
             (long)in_stack_fffffffffffffec8 * (long)tsdn_00);
    }
    local_120 = (edata_t *)((long)&local_120->e_bits + (long)in_stack_fffffffffffffec8->nthreads);
    if (in_stack_fffffffffffffec8 == ptrs_00) {
      if ((bVar3 & 1) != 0) {
        edata_list_active_append((edata_list_active_t *)&stack0xfffffffffffffed0,item);
      }
      item = (edata_t *)0x0;
    }
  }
  malloc_mutex_lock((tsdn_t *)item,(malloc_mutex_t *)in_stack_fffffffffffffed0.head.qlh_first);
  if (item != (edata_t *)0x0) {
    arena_bin_lower_slab
              ((tsdn_t *)in_stack_fffffffffffffed0.head.qlh_first,in_stack_fffffffffffffec8,
               (edata_t *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (bin_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  if ((bVar3 & 1) != 0) {
    edata_list_active_concat(&pbVar4->slabs_full,(edata_list_active_t *)&stack0xfffffffffffffed0);
  }
  (pbVar4->stats).nslabs = (long)&bin_info_00->reg_size + (pbVar4->stats).nslabs;
  (pbVar4->stats).curslabs = (long)&bin_info_00->reg_size + (pbVar4->stats).curslabs;
  (pbVar4->stats).nmalloc = (long)&local_120->e_bits + (pbVar4->stats).nmalloc;
  (pbVar4->stats).nrequests = (long)&local_120->e_bits + (pbVar4->stats).nrequests;
  (pbVar4->stats).curregs = (long)&local_120->e_bits + (pbVar4->stats).curregs;
  malloc_mutex_unlock((tsdn_t *)in_stack_fffffffffffffed0.head.qlh_first,
                      (malloc_mutex_t *)in_stack_fffffffffffffec8);
  if ((in_RDI != 0) &&
     (_Var2 = ticker_geom_ticks((ticker_geom_t *)in_stack_fffffffffffffec8,
                                (uint64_t *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                in_stack_fffffffffffffebc,
                                SUB41((uint)in_stack_fffffffffffffeb8 >> 0x18,0)), _Var2)) {
    duckdb_je_arena_decay
              ((tsdn_t *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (arena_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),false,false)
    ;
  }
  return (size_t)local_120;
}

Assistant:

size_t
arena_fill_small_fresh(tsdn_t *tsdn, arena_t *arena, szind_t binind,
    void **ptrs, size_t nfill, bool zero) {
	assert(binind < SC_NBINS);
	const bin_info_t *bin_info = &bin_infos[binind];
	const size_t nregs = bin_info->nregs;
	assert(nregs > 0);
	const size_t usize = bin_info->reg_size;

	const bool manual_arena = !arena_is_auto(arena);
	unsigned binshard;
	bin_t *bin = arena_bin_choose(tsdn, arena, binind, &binshard);

	size_t nslab = 0;
	size_t filled = 0;
	edata_t *slab = NULL;
	edata_list_active_t fulls;
	edata_list_active_init(&fulls);

	while (filled < nfill && (slab = arena_slab_alloc(tsdn, arena, binind,
	    binshard, bin_info)) != NULL) {
		assert((size_t)edata_nfree_get(slab) == nregs);
		++nslab;
		size_t batch = nfill - filled;
		if (batch > nregs) {
			batch = nregs;
		}
		assert(batch > 0);
		arena_slab_reg_alloc_batch(slab, bin_info, (unsigned)batch,
		    &ptrs[filled]);
		assert(edata_addr_get(slab) == ptrs[filled]);
		if (zero) {
			memset(ptrs[filled], 0, batch * usize);
		}
		filled += batch;
		if (batch == nregs) {
			if (manual_arena) {
				edata_list_active_append(&fulls, slab);
			}
			slab = NULL;
		}
	}

	malloc_mutex_lock(tsdn, &bin->lock);
	/*
	 * Only the last slab can be non-empty, and the last slab is non-empty
	 * iff slab != NULL.
	 */
	if (slab != NULL) {
		arena_bin_lower_slab(tsdn, arena, slab, bin);
	}
	if (manual_arena) {
		edata_list_active_concat(&bin->slabs_full, &fulls);
	}
	assert(edata_list_active_empty(&fulls));
	if (config_stats) {
		bin->stats.nslabs += nslab;
		bin->stats.curslabs += nslab;
		bin->stats.nmalloc += filled;
		bin->stats.nrequests += filled;
		bin->stats.curregs += filled;
	}
	malloc_mutex_unlock(tsdn, &bin->lock);

	arena_decay_tick(tsdn, arena);
	return filled;
}